

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O0

bool __thiscall QMakeParser::failOperator(QMakeParser *this,char *msg)

{
  QString *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar1;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  bool fail;
  QString *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  undefined4 in_stack_fffffffffffffe90;
  uint3 in_stack_fffffffffffffe94;
  uint fieldWidth;
  bool bVar7;
  QString *a;
  QString *in_stack_fffffffffffffea0;
  storage_type *local_158;
  undefined1 local_148 [22];
  QChar in_stack_fffffffffffffece;
  storage_type *local_130;
  undefined1 local_120 [54];
  QChar local_ea;
  storage_type *local_e8;
  undefined1 local_d8 [24];
  storage_type *local_c0;
  undefined1 local_b0 [54];
  QChar local_7a;
  storage_type *local_78;
  undefined1 local_68 [24];
  storage_type *local_50;
  undefined1 local_40 [56];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  fieldWidth = (uint)in_stack_fffffffffffffe94;
  a = in_RDI;
  if (*(int *)((long)(in_RDI + 2) + 4) != 0) {
    QByteArrayView::QByteArrayView<28ul>
              ((QByteArrayView *)
               (ulong)CONCAT34(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               (char (*) [28])in_RDI);
    QVar1.m_data = local_50;
    QVar1.m_size = (qsizetype)local_40;
    QString::fromLatin1(QVar1);
    QByteArrayView::QByteArrayView<const_char_*,_true>
              ((QByteArrayView *)CONCAT44(fieldWidth,in_stack_fffffffffffffe90),(char **)in_RDI);
    QVar2.m_data = local_78;
    QVar2.m_size = (qsizetype)local_68;
    QString::fromLatin1(QVar2);
    QChar::QChar<char16_t,_true>(&local_7a,L' ');
    QString::arg<QString,_true>(in_stack_fffffffffffffea0,a,fieldWidth,in_stack_fffffffffffffece);
    parseError((QMakeParser *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe78);
    QString::~QString((QString *)0x31499e);
    QString::~QString((QString *)0x3149ab);
    QString::~QString((QString *)0x3149b8);
    *(char *)((long)&in_RDI[2].d.d + 4) = '\0';
    *(char *)((long)&in_RDI[2].d.d + 5) = '\0';
    *(char *)((long)&in_RDI[2].d.d + 6) = '\0';
    *(char *)((long)&in_RDI[2].d.d + 7) = '\0';
    fieldWidth = CONCAT13(1,(int3)fieldWidth);
  }
  if (*(int *)((long)(in_RDI + 2) + 8) == 1) {
    QByteArrayView::QByteArrayView<28ul>
              ((QByteArrayView *)CONCAT44(fieldWidth,in_stack_fffffffffffffe90),
               (char (*) [28])in_RDI);
    QVar3.m_data = local_c0;
    QVar3.m_size = (qsizetype)local_b0;
    QString::fromLatin1(QVar3);
    QByteArrayView::QByteArrayView<const_char_*,_true>
              ((QByteArrayView *)CONCAT44(fieldWidth,in_stack_fffffffffffffe90),(char **)in_RDI);
    QVar4.m_data = local_e8;
    QVar4.m_size = (qsizetype)local_d8;
    QString::fromLatin1(QVar4);
    QChar::QChar<char16_t,_true>(&local_ea,L' ');
    QString::arg<QString,_true>(in_stack_fffffffffffffea0,a,fieldWidth,in_stack_fffffffffffffece);
    parseError((QMakeParser *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe78);
    QString::~QString((QString *)0x314a94);
    QString::~QString((QString *)0x314aa1);
    QString::~QString((QString *)0x314aae);
    *(undefined4 *)((long)(in_RDI + 2) + 8) = 0;
    bVar7 = true;
  }
  else {
    if (*(int *)((long)(in_RDI + 2) + 8) == 2) {
      QByteArrayView::QByteArrayView<27ul>
                ((QByteArrayView *)CONCAT44(fieldWidth,in_stack_fffffffffffffe90),
                 (char (*) [27])in_RDI);
      QVar5.m_data = local_130;
      QVar5.m_size = (qsizetype)local_120;
      QString::fromLatin1(QVar5);
      QByteArrayView::QByteArrayView<const_char_*,_true>
                ((QByteArrayView *)CONCAT44(fieldWidth,in_stack_fffffffffffffe90),(char **)in_RDI);
      QVar6.m_data = local_158;
      QVar6.m_size = (qsizetype)local_148;
      QString::fromLatin1(QVar6);
      QChar::QChar<char16_t,_true>((QChar *)&stack0xfffffffffffffea6,L' ');
      QString::arg<QString,_true>(in_stack_fffffffffffffea0,a,fieldWidth,in_stack_fffffffffffffece);
      parseError((QMakeParser *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                 in_stack_fffffffffffffe78);
      QString::~QString((QString *)0x314b6b);
      QString::~QString((QString *)0x314b75);
      QString::~QString((QString *)0x314b7f);
      *(undefined4 *)((long)(in_RDI + 2) + 8) = 0;
      fieldWidth = 0x1000000;
    }
    bVar7 = SUB41(fieldWidth >> 0x18,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool QMakeParser::failOperator(const char *msg)
{
    bool fail = false;
    if (m_invert) {
        parseError(fL1S("Unexpected NOT operator %1.").arg(fL1S(msg)));
        m_invert = 0;
        fail = true;
    }
    if (m_operator == AndOperator) {
        parseError(fL1S("Unexpected AND operator %1.").arg(fL1S(msg)));
        m_operator = NoOperator;
        fail = true;
    } else if (m_operator == OrOperator) {
        parseError(fL1S("Unexpected OR operator %1.").arg(fL1S(msg)));
        m_operator = NoOperator;
        fail = true;
    }
    return fail;
}